

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayout::removePlaceHolder(QDockAreaLayout *this,QString *name)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator o;
  QDockAreaLayoutInfo *this_01;
  QString *in_RSI;
  QDockAreaLayout *in_RDI;
  long in_FS_OFFSET;
  QDockWidgetGroupWindow *dwgw;
  QList<QDockWidgetGroupWindow_*> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QDockWidgetGroupWindow_*> groups;
  QList<int> index;
  undefined4 in_stack_ffffffffffffff58;
  FindChildOption in_stack_ffffffffffffff5c;
  QMainWindow *this_02;
  QObject *in_stack_ffffffffffffff70;
  QString *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  QFlagsStorage<Qt::FindChildOption> in_stack_ffffffffffffff9c;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  indexOfPlaceHolder(in_RDI,in_RSI);
  bVar1 = QList<int>::isEmpty((QList<int> *)0x57895c);
  if (!bVar1) {
    remove(in_RDI,(char *)&local_20);
  }
  this_02 = in_RDI->mainWindow;
  QFlags<Qt::FindChildOption>::QFlags
            ((QFlags<Qt::FindChildOption> *)this_02,in_stack_ffffffffffffff5c);
  QObject::findChildren<QDockWidgetGroupWindow*>
            (in_stack_ffffffffffffff70,(FindChildOptions)in_stack_ffffffffffffff9c.i);
  this_00 = QList<QDockWidgetGroupWindow_*>::begin((QList<QDockWidgetGroupWindow_*> *)this_02);
  o = QList<QDockWidgetGroupWindow_*>::end((QList<QDockWidgetGroupWindow_*> *)this_02);
  while( true ) {
    bVar1 = QList<QDockWidgetGroupWindow_*>::const_iterator::operator!=
                      ((const_iterator *)&stack0xffffffffffffffb8,o);
    if (!bVar1) break;
    QList<QDockWidgetGroupWindow_*>::const_iterator::operator*
              ((const_iterator *)&stack0xffffffffffffffb8);
    QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x578a53);
    QDockAreaLayoutInfo::indexOfPlaceHolder
              ((QDockAreaLayoutInfo *)
               CONCAT44(in_stack_ffffffffffffff9c.i,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffff90);
    QList<int>::operator=
              ((QList<int> *)this_02,
               (QList<int> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QList<int>::~QList((QList<int> *)0x578a81);
    bVar1 = QList<int>::isEmpty((QList<int> *)0x578a8e);
    if (!bVar1) {
      this_01 = QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x578a9c);
      QDockAreaLayoutInfo::remove(this_01,(char *)&local_20);
      QDockWidgetGroupWindow::destroyOrHideIfEmpty((QDockWidgetGroupWindow *)this_00.i);
    }
    QList<QDockWidgetGroupWindow_*>::const_iterator::operator++
              ((const_iterator *)&stack0xffffffffffffffb8);
  }
  QList<QDockWidgetGroupWindow_*>::~QList((QList<QDockWidgetGroupWindow_*> *)0x578ad1);
  QList<int>::~QList((QList<int> *)0x578ade);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::removePlaceHolder(const QString &name)
{
    QList<int> index = indexOfPlaceHolder(name);
    if (!index.isEmpty())
        remove(index);
    const auto groups =
            mainWindow->findChildren<QDockWidgetGroupWindow *>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups) {
        index = dwgw->layoutInfo()->indexOfPlaceHolder(name);
        if (!index.isEmpty()) {
            dwgw->layoutInfo()->remove(index);
            dwgw->destroyOrHideIfEmpty();
        }
    }
}